

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O0

void __thiscall
Eigen::internal::CompressedStorage<double,_int>::resize
          (CompressedStorage<double,_int> *this,Index size,double reserveSizeFactor)

{
  int iVar1;
  long *plVar2;
  long local_38;
  long local_30;
  long local_28;
  Index realloc_size;
  double reserveSizeFactor_local;
  Index size_local;
  CompressedStorage<double,_int> *this_local;
  
  reserveSizeFactor_local = (double)size;
  if (this->m_allocatedSize < size) {
    realloc_size = (Index)reserveSizeFactor;
    size_local = (Index)this;
    iVar1 = GenericNumTraits<int>::highest();
    local_30 = (long)iVar1;
    local_38 = (long)reserveSizeFactor_local +
               (long)((double)realloc_size * (double)(long)reserveSizeFactor_local);
    plVar2 = std::min<long>(&local_30,&local_38);
    local_28 = *plVar2;
    if (local_28 < (long)reserveSizeFactor_local) {
      throw_std_bad_alloc();
    }
    reallocate(this,local_28);
  }
  this->m_size = (Index)reserveSizeFactor_local;
  return;
}

Assistant:

void resize(Index size, double reserveSizeFactor = 0)
    {
      if (m_allocatedSize<size)
      {
        Index realloc_size = (std::min<Index>)(NumTraits<StorageIndex>::highest(),  size + Index(reserveSizeFactor*double(size)));
        if(realloc_size<size)
          internal::throw_std_bad_alloc();
        reallocate(realloc_size);
      }
      m_size = size;
    }